

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection.cpp
# Opt level: O0

void __thiscall
glslang::TReflectionTraverser::addPipeIOVariable(TReflectionTraverser *this,TIntermSymbol *base)

{
  EShLanguageMask EVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  int pSize;
  EShLanguage EVar5;
  undefined4 extraout_var;
  TType *type_00;
  undefined4 extraout_var_01;
  TMapIndexToReflection *this_01;
  undefined4 extraout_var_02;
  char *pcVar6;
  size_type sVar7;
  mapped_type *pmVar8;
  pointer ppVar9;
  reference pvVar10;
  TNameToIndex *local_298;
  EShLanguageMask *stages_1;
  EShLanguageMask *stages;
  string local_268;
  TObjectReflection local_248;
  allocator<char> local_1f1;
  key_type local_1f0;
  iterator local_1d0;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
  local_1c8;
  allocator<char> local_1b9;
  key_type local_1b8;
  iterator local_198;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
  local_190;
  const_iterator it;
  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> local_c8;
  undefined1 local_a0 [8];
  TString baseName;
  bool anonymous;
  TNameToIndex *ioMapper;
  TMapIndexToReflection *ioItems;
  bool input;
  TType *type;
  TString *name;
  TIntermSymbol *local_38;
  _Self local_30;
  TIntermSymbol *local_28;
  _Self local_20;
  TIntermSymbol *local_18;
  TIntermSymbol *base_local;
  TReflectionTraverser *this_local;
  TString *this_00;
  undefined4 extraout_var_00;
  
  local_28 = base;
  local_18 = base;
  base_local = (TIntermSymbol *)this;
  local_20._M_node =
       (_Base_ptr)
       std::
       set<const_TIntermNode_*,_std::less<const_TIntermNode_*>,_std::allocator<const_TIntermNode_*>_>
       ::find(&this->processedDerefs,(key_type *)&local_28);
  local_30._M_node =
       (_Base_ptr)
       std::
       set<const_TIntermNode_*,_std::less<const_TIntermNode_*>,_std::allocator<const_TIntermNode_*>_>
       ::end(&this->processedDerefs);
  bVar2 = std::operator==(&local_20,&local_30);
  if (bVar2) {
    local_38 = local_18;
    std::
    set<const_TIntermNode_*,_std::less<const_TIntermNode_*>,_std::allocator<const_TIntermNode_*>_>::
    insert(&this->processedDerefs,(value_type *)&local_38);
    iVar3 = (*(local_18->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x32])();
    this_00 = (TString *)CONCAT44(extraout_var,iVar3);
    iVar3 = (*(local_18->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])();
    type_00 = (TType *)CONCAT44(extraout_var_00,iVar3);
    iVar3 = (*(local_18->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])();
    bVar2 = TQualifier::isPipeInput((TQualifier *)CONCAT44(extraout_var_01,iVar3));
    if (bVar2) {
      this_01 = &this->reflection->indexToPipeInput;
      local_298 = &this->reflection->pipeInNameToIndex;
    }
    else {
      this_01 = &this->reflection->indexToPipeOutput;
      local_298 = &this->reflection->pipeOutNameToIndex;
    }
    if ((this->reflection->options & EShReflectionUnwrapIOBlocks) == EShReflectionDefault) {
      pcVar6 = std::__cxx11::
               basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::c_str
                         (this_00);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_1b8,pcVar6,&local_1b9);
      local_198._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::find(local_298,&local_1b8);
      std::
      _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
      ::_Rb_tree_const_iterator(&local_190,&local_198);
      std::__cxx11::string::~string((string *)&local_1b8);
      std::allocator<char>::~allocator(&local_1b9);
      local_1d0._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::end(local_298);
      std::
      _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
      ::_Rb_tree_const_iterator(&local_1c8,&local_1d0);
      bVar2 = std::operator==(&local_190,&local_1c8);
      if (bVar2) {
        sVar7 = std::vector<glslang::TObjectReflection,_std::allocator<glslang::TObjectReflection>_>
                ::size(this_01);
        pcVar6 = std::__cxx11::
                 basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::c_str
                           (this_00);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_1f0,pcVar6,&local_1f1);
        pmVar8 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                 ::operator[](local_298,&local_1f0);
        *pmVar8 = (mapped_type)sVar7;
        std::__cxx11::string::~string((string *)&local_1f0);
        std::allocator<char>::~allocator(&local_1f1);
        pcVar6 = std::__cxx11::
                 basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::c_str
                           (this_00);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_268,pcVar6,(allocator<char> *)((long)&stages + 7));
        iVar3 = mapToGlType(this,type_00);
        pSize = mapToGlArraySize(this,type_00);
        TObjectReflection::TObjectReflection(&local_248,&local_268,type_00,0,iVar3,pSize,0);
        std::vector<glslang::TObjectReflection,_std::allocator<glslang::TObjectReflection>_>::
        push_back(this_01,&local_248);
        TObjectReflection::~TObjectReflection(&local_248);
        std::__cxx11::string::~string((string *)&local_268);
        std::allocator<char>::~allocator((allocator<char> *)((long)&stages + 7));
        pvVar10 = std::
                  vector<glslang::TObjectReflection,_std::allocator<glslang::TObjectReflection>_>::
                  back(this_01);
        EVar1 = pvVar10->stages;
        EVar5 = TIntermediate::getStage(this->intermediate);
        pvVar10->stages = EVar1 | 1 << ((byte)EVar5 & 0x1f);
      }
      else {
        ppVar9 = std::
                 _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
                 ::operator->(&local_190);
        pvVar10 = std::
                  vector<glslang::TObjectReflection,_std::allocator<glslang::TObjectReflection>_>::
                  operator[](this_01,(long)ppVar9->second);
        EVar1 = pvVar10->stages;
        EVar5 = TIntermediate::getStage(this->intermediate);
        pvVar10->stages = EVar1 | 1 << ((byte)EVar5 & 0x1f);
      }
    }
    else {
      baseName.field_2._M_local_buf[0xf] = IsAnonymous(this_00);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
      basic_string((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
                   local_a0);
      iVar3 = (*type_00->_vptr_TType[7])();
      if (iVar3 == 0x10) {
        if ((baseName.field_2._M_local_buf[0xf] & 1U) == 0) {
          iVar3 = (*type_00->_vptr_TType[5])();
          std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
          basic_string(&local_c8,
                       (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *
                       )CONCAT44(extraout_var_02,iVar3));
        }
        else {
          std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
          basic_string(&local_c8);
        }
        std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
        operator=((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
                  local_a0,&local_c8);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
        ~basic_string(&local_c8);
      }
      else {
        if ((baseName.field_2._M_local_buf[0xf] & 1U) == 0) {
          std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
          basic_string(&local_f0,this_00);
        }
        else {
          std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
          basic_string(&local_f0);
        }
        std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
        operator=((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
                  local_a0,&local_f0);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
        ~basic_string(&local_f0);
      }
      uVar4 = (*type_00->_vptr_TType[0x1d])();
      if (((uVar4 & 1) == 0) || (iVar3 = (*type_00->_vptr_TType[7])(), iVar3 != 0x10)) {
        blowUpIOAggregate(this,bVar2,(TString *)local_a0,type_00);
      }
      else {
        TType::TType((TType *)&it,type_00,0,false);
        blowUpIOAggregate(this,bVar2,(TString *)local_a0,(TType *)&it);
        TType::~TType((TType *)&it);
      }
      std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
      ~basic_string((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
                    local_a0);
    }
  }
  return;
}

Assistant:

void addPipeIOVariable(const TIntermSymbol& base)
    {
        if (processedDerefs.find(&base) == processedDerefs.end()) {
            processedDerefs.insert(&base);

            const TString &name = base.getName();
            const TType &type = base.getType();
            const bool input = base.getQualifier().isPipeInput();

            TReflection::TMapIndexToReflection &ioItems =
                input ? reflection.indexToPipeInput : reflection.indexToPipeOutput;


            TReflection::TNameToIndex &ioMapper =
                input ? reflection.pipeInNameToIndex : reflection.pipeOutNameToIndex;

            if (reflection.options & EShReflectionUnwrapIOBlocks) {
                bool anonymous = IsAnonymous(name);

                TString baseName;
                if (type.getBasicType() == EbtBlock) {
                    baseName = anonymous ? TString() : type.getTypeName();
                } else {
                    baseName = anonymous ? TString() : name;
                }

                // by convention if this is an arrayed block we ignore the array in the reflection
                if (type.isArray() && type.getBasicType() == EbtBlock) {
                    blowUpIOAggregate(input, baseName, TType(type, 0));
                } else {               
                    blowUpIOAggregate(input, baseName, type);
                }
            } else {
                TReflection::TNameToIndex::const_iterator it = ioMapper.find(name.c_str());
                if (it == ioMapper.end()) {
                    // seperate pipe i/o params from uniforms and blocks
                    // in is only for input in first stage as out is only for last stage. check traverse in call stack.
                    ioMapper[name.c_str()] = static_cast<int>(ioItems.size());
                    ioItems.push_back(
                        TObjectReflection(name.c_str(), type, 0, mapToGlType(type), mapToGlArraySize(type), 0));
                    EShLanguageMask& stages = ioItems.back().stages;
                    stages = static_cast<EShLanguageMask>(stages | 1 << intermediate.getStage());
                } else {
                    EShLanguageMask& stages = ioItems[it->second].stages;
                    stages = static_cast<EShLanguageMask>(stages | 1 << intermediate.getStage());
                }
            }
        }
    }